

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::Add
          (PersistentStorageJson *this,Registrar *aValue,RegistrarId *aRetId)

{
  Status SVar1;
  string local_60;
  string local_40;
  RegistrarId *local_20;
  RegistrarId *aRetId_local;
  Registrar *aValue_local;
  PersistentStorageJson *this_local;
  
  local_20 = aRetId;
  aRetId_local = &aValue->mId;
  aValue_local = (Registrar *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)JSON_RGR_SEQ_abi_cxx11_);
  std::__cxx11::string::string((string *)&local_60,(string *)JSON_RGR_abi_cxx11_);
  SVar1 = AddOne<ot::commissioner::persistent_storage::Registrar,ot::commissioner::persistent_storage::RegistrarId>
                    (this,aValue,aRetId,&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return SVar1;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::Add(Registrar const &aValue, RegistrarId &aRetId)
{
    return AddOne<Registrar, RegistrarId>(aValue, aRetId, JSON_RGR_SEQ, JSON_RGR);
}